

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbsessionmanager.cpp
# Opt level: O0

void sm_performSaveYourself(QXcbSessionManager *sm)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  bool bVar1;
  __uid_t __uid;
  int iVar2;
  char *__buffer;
  size_t __buflen;
  size_type sVar3;
  ulong uVar4;
  long *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  int value;
  SmPropValue prop;
  QStringList discard;
  QFileInfo fi;
  QStringList restart;
  passwd entry;
  passwd *entryPtr;
  QString argument0;
  QStringList arguments;
  timeval tv;
  QVarLengthArray<char,_1024LL> buf;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *in_stack_fffffffffffff7b8;
  SmcConn p_Var10;
  int num_vals;
  undefined7 in_stack_fffffffffffff7c0;
  byte in_stack_fffffffffffff7c7;
  QStringBuilder<QString,_char16_t> *in_stack_fffffffffffff7c8;
  char (*data) [15];
  undefined4 in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d4;
  QList<QString> *in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7f0;
  undefined4 local_7cc;
  undefined8 local_7c8;
  undefined4 *local_7c0;
  undefined1 local_7b8 [24];
  storage_type *local_7a0;
  undefined1 local_790 [24];
  undefined1 local_778 [24];
  storage_type *local_760;
  undefined1 local_750 [24];
  char local_738 [72];
  undefined1 local_6f0 [24];
  undefined1 local_6d8 [24];
  undefined1 local_6c0 [24];
  undefined8 local_6a8;
  undefined1 local_6a0 [30];
  undefined2 local_682;
  undefined1 local_680 [72];
  undefined8 local_638;
  undefined8 local_630;
  undefined8 local_628;
  storage_type *local_620;
  undefined1 local_610 [24];
  storage_type *local_5f8;
  undefined1 local_5e8 [24];
  passwd local_5d0;
  long local_5a0;
  long local_598;
  passwd *local_590;
  storage_type *local_588;
  undefined1 local_578 [24];
  undefined8 local_560;
  undefined8 local_558;
  undefined8 local_550;
  undefined8 local_548;
  undefined8 local_540;
  undefined8 local_538;
  undefined1 local_530 [30];
  undefined2 local_512;
  undefined1 local_510 [48];
  timeval local_4e0 [12];
  QVLABaseBase local_420 [43];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (sm_isshutdown) {
    qt_sm_blockUserInput = true;
  }
  local_4e0[0].tv_sec = -0x5555555555555556;
  local_4e0[0].tv_usec = -0x5555555555555556;
  gettimeofday(local_4e0,(__timezone_ptr_t)0x0);
  QString::number((ulonglong)local_510,(int)local_4e0[0].tv_sec);
  local_512 = 0x5f;
  operator+(&in_stack_fffffffffffff7c8->a,
            (char16_t *)CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0));
  QString::number((ulonglong)local_530,(int)local_4e0[0].tv_usec);
  operator+(in_stack_fffffffffffff7c8,
            (QString *)CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0));
  QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffff7b8);
  QXcbSessionManager::setSessionKey
            ((QXcbSessionManager *)CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),
             (QString *)in_stack_fffffffffffff7b8);
  QString::~QString((QString *)0x20da82);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)
             CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0));
  QString::~QString((QString *)0x20da9c);
  QStringBuilder<QString,_char16_t>::~QStringBuilder((QStringBuilder<QString,_char16_t> *)0x20daa9);
  QString::~QString((QString *)0x20dab6);
  local_548 = 0xaaaaaaaaaaaaaaaa;
  local_540 = 0xaaaaaaaaaaaaaaaa;
  local_538 = 0xaaaaaaaaaaaaaaaa;
  QCoreApplication::arguments();
  local_560 = 0xaaaaaaaaaaaaaaaa;
  local_558 = 0xaaaaaaaaaaaaaaaa;
  local_550 = 0xaaaaaaaaaaaaaaaa;
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x20db2a);
  if (bVar1) {
    QCoreApplication::applicationFilePath();
  }
  else {
    QList<QString>::at((QList<QString> *)
                       CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),
                       (qsizetype)in_stack_fffffffffffff7b8);
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),
                     (QString *)in_stack_fffffffffffff7b8);
  }
  QByteArrayView::QByteArrayView<8ul>
            ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
             (char (*) [8])in_stack_fffffffffffff7c8);
  QVar5.m_data = local_588;
  QVar5.m_size = (qsizetype)local_578;
  QString::fromLatin1(QVar5);
  sm_setProperty((QString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                 &in_stack_fffffffffffff7c8->a);
  QString::~QString((QString *)0x20dbb3);
  local_590 = (passwd *)0x0;
  memset(local_420,0xaa,0x418);
  local_598 = sysconf(0x46);
  local_5a0 = 0x400;
  qMax<long>(&local_598,&local_5a0);
  QVarLengthArray<char,_1024LL>::QVarLengthArray
            ((QVarLengthArray<char,_1024LL> *)
             CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),
             (qsizetype)in_stack_fffffffffffff7b8);
  memset(&local_5d0,0xaa,0x30);
  do {
    __uid = geteuid();
    __buffer = QVLABase<char>::data((QVLABase<char> *)local_420);
    __buflen = QVLABaseBase::size(local_420);
    iVar2 = getpwuid_r(__uid,&local_5d0,__buffer,__buflen,&local_590);
    if (iVar2 != 0x22) {
LAB_0020dcd9:
      if (local_590 != (passwd *)0x0) {
        QByteArrayView::QByteArrayView<7ul>
                  ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                   (char (*) [7])in_stack_fffffffffffff7c8);
        QVar6.m_data = local_5f8;
        QVar6.m_size = (qsizetype)local_5e8;
        QString::fromLatin1(QVar6);
        QByteArrayView::QByteArrayView<char_*,_true>
                  ((QByteArrayView *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                   (char **)in_stack_fffffffffffff7c8);
        QVar7.m_data = local_620;
        QVar7.m_size = (qsizetype)local_610;
        QString::fromLocal8Bit(QVar7);
        sm_setProperty((QString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                       &in_stack_fffffffffffff7c8->a);
        QString::~QString((QString *)0x20dd6d);
        QString::~QString((QString *)0x20dd7a);
      }
      local_638 = 0xaaaaaaaaaaaaaaaa;
      local_630 = 0xaaaaaaaaaaaaaaaa;
      local_628 = 0xaaaaaaaaaaaaaaaa;
      QList<QString>::QList((QList<QString> *)0x20ddb4);
      QList<QString>::operator<<
                ((QList<QString> *)CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),
                 (parameter_type)in_stack_fffffffffffff7b8);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffff7c8,
                 CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0));
      latin1.m_size._4_4_ = __uid;
      latin1.m_size._0_4_ = in_stack_fffffffffffff7f0;
      latin1.m_data = __buffer;
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                       latin1);
      QList<QString>::operator<<
                ((QList<QString> *)CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),
                 (rvalue_ref)in_stack_fffffffffffff7b8);
      (**(code **)(*in_RDI + 0x10))(local_680);
      local_682 = 0x5f;
      operator+(&in_stack_fffffffffffff7c8->a,
                (char16_t *)CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0));
      (**(code **)(*in_RDI + 0x18))(local_6a0);
      operator+(in_stack_fffffffffffff7c8,
                (QString *)CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0));
      QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffff7b8);
      QList<QString>::operator<<
                ((QList<QString> *)CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),
                 (rvalue_ref)in_stack_fffffffffffff7b8);
      QString::~QString((QString *)0x20deb5);
      QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)
                 CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0));
      QString::~QString((QString *)0x20decf);
      QStringBuilder<QString,_char16_t>::~QStringBuilder
                ((QStringBuilder<QString,_char16_t> *)0x20dedc);
      QString::~QString((QString *)0x20dee9);
      QString::~QString((QString *)0x20def6);
      local_6a8 = 0xaaaaaaaaaaaaaaaa;
      QCoreApplication::applicationFilePath();
      QFileInfo::QFileInfo((QFileInfo *)&local_6a8,(QString *)local_6c0);
      QString::~QString((QString *)0x20df34);
      qAppName();
      QFileInfo::fileName();
      iVar2 = QString::compare((QString *)local_6d8,(CaseSensitivity)local_6f0);
      QString::~QString((QString *)0x20df7e);
      QString::~QString((QString *)0x20df8b);
      if (iVar2 != 0) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffff7c8,
                   CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0));
        latin1_00.m_size._4_4_ = __uid;
        latin1_00.m_size._0_4_ = iVar2;
        latin1_00.m_data = __buffer;
        QString::QString((QString *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                         latin1_00);
        in_stack_fffffffffffff7d8 =
             QList<QString>::operator<<
                       ((QList<QString> *)
                        CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),
                        (rvalue_ref)in_stack_fffffffffffff7b8);
        qAppName();
        QList<QString>::operator<<
                  ((QList<QString> *)CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),
                   (rvalue_ref)in_stack_fffffffffffff7b8);
        QString::~QString((QString *)0x20e010);
        QString::~QString((QString *)0x20e01d);
      }
      num_vals = (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20);
      (**(code **)(*in_RDI + 0x50))(in_RDI,&local_638);
      local_738[0x10] = -0x56;
      local_738[0x11] = -0x56;
      local_738[0x12] = -0x56;
      local_738[0x13] = -0x56;
      local_738[0x14] = -0x56;
      local_738[0x15] = -0x56;
      local_738[0x16] = -0x56;
      local_738[0x17] = -0x56;
      local_738[0] = -0x56;
      local_738[1] = -0x56;
      local_738[2] = -0x56;
      local_738[3] = -0x56;
      local_738[4] = -0x56;
      local_738[5] = -0x56;
      local_738[6] = -0x56;
      local_738[7] = -0x56;
      local_738[8] = -0x56;
      local_738[9] = -0x56;
      local_738[10] = -0x56;
      local_738[0xb] = -0x56;
      local_738[0xc] = -0x56;
      local_738[0xd] = -0x56;
      local_738[0xe] = -0x56;
      local_738[0xf] = -0x56;
      data = (char (*) [15])local_738;
      QList<QString>::QList((QList<QString> *)0x20e066);
      (**(code **)(*in_RDI + 0x60))(in_RDI,data);
      iVar2 = sm_saveType;
      if (sm_saveType == 0) {
        QPlatformSessionManager::appCommitData();
      }
      else if ((sm_saveType == 1) ||
              ((sm_saveType == 2 &&
               ((QPlatformSessionManager::appCommitData(), (sm_isshutdown & 1U) == 0 ||
                ((sm_cancel & 1U) == 0)))))) {
        QPlatformSessionManager::appSaveState();
      }
      if (((sm_phase2 & 1U) == 0) || ((sm_in_phase2 & 1U) != 0)) {
        if ((sm_interactionActive & 1U) == 0) {
          if ((((sm_cancel & 1U) != 0) && ((sm_isshutdown & 1U) != 0)) &&
             (uVar4 = (**(code **)(*in_RDI + 0x28))(), (uVar4 & 1) != 0)) {
            SmcInteractDone(smcConnection,1);
            sm_interactionActive = false;
          }
        }
        else {
          in_stack_fffffffffffff7c7 = 0;
          if ((sm_isshutdown & 1U) != 0) {
            in_stack_fffffffffffff7c7 = sm_cancel;
          }
          p_Var10 = smcConnection;
          SmcInteractDone(smcConnection,in_stack_fffffffffffff7c7 & 1);
          num_vals = (int)((ulong)p_Var10 >> 0x20);
          sm_interactionActive = false;
        }
        QByteArrayView::QByteArrayView<15ul>
                  ((QByteArrayView *)CONCAT44(iVar2,in_stack_fffffffffffff7d0),data);
        QVar8.m_data = local_760;
        QVar8.m_size = (qsizetype)local_750;
        QString::fromLatin1(QVar8);
        (**(code **)(*in_RDI + 0x58))(local_778);
        sm_setProperty((QString *)in_stack_fffffffffffff7d8,
                       (QStringList *)CONCAT44(iVar2,in_stack_fffffffffffff7d0));
        QList<QString>::~QList((QList<QString> *)0x20e1fc);
        QString::~QString((QString *)0x20e209);
        QByteArrayView::QByteArrayView<15ul>
                  ((QByteArrayView *)CONCAT44(iVar2,in_stack_fffffffffffff7d0),data);
        QVar9.m_data = local_7a0;
        QVar9.m_size = (qsizetype)local_790;
        QString::fromLatin1(QVar9);
        (**(code **)(*in_RDI + 0x68))(local_7b8);
        sm_setProperty((QString *)in_stack_fffffffffffff7d8,
                       (QStringList *)CONCAT44(iVar2,in_stack_fffffffffffff7d0));
        QList<QString>::~QList((QList<QString> *)0x20e26f);
        QString::~QString((QString *)0x20e27c);
        local_7c0 = (undefined4 *)0xaaaaaaaaaaaaaaaa;
        local_7c8 = 0xaaaaaaaa00000004;
        local_7cc = (**(code **)(*in_RDI + 0x48))();
        local_7c0 = &local_7cc;
        sm_setProperty(*data,(char *)CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),
                       num_vals,(SmPropValue *)0x20e2e1);
        SmcSaveYourselfDone(smcConnection,(sm_cancel ^ 0xffU) & 1);
      }
      else {
        SmcRequestSaveYourselfPhase2(smcConnection,sm_saveYourselfPhase2Callback,in_RDI);
        qt_sm_blockUserInput = false;
      }
      QList<QString>::~QList((QList<QString> *)0x20e307);
      QFileInfo::~QFileInfo((QFileInfo *)&local_6a8);
      QList<QString>::~QList((QList<QString> *)0x20e321);
      QVarLengthArray<char,_1024LL>::~QVarLengthArray
                ((QVarLengthArray<char,_1024LL> *)
                 CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0));
      QString::~QString((QString *)0x20e33b);
      QList<QString>::~QList((QList<QString> *)0x20e348);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    sVar3 = QVLABaseBase::size(local_420);
    if (0x7fff < sVar3) {
      local_590 = &local_5d0;
      local_5d0.pw_name = sm_performSaveYourself::badusername;
      goto LAB_0020dcd9;
    }
    QVLABaseBase::size(local_420);
    QVarLengthArray<char,_1024LL>::resize
              ((QVarLengthArray<char,_1024LL> *)
               CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),
               (qsizetype)in_stack_fffffffffffff7b8);
  } while( true );
}

Assistant:

static void sm_performSaveYourself(QXcbSessionManager *sm)
{
    if (sm_isshutdown)
        qt_sm_blockUserInput = true;

    // generate a new session key
    timeval tv;
    gettimeofday(&tv, nullptr);
    sm->setSessionKey(QString::number(qulonglong(tv.tv_sec)) +
                      u'_' +
                      QString::number(qulonglong(tv.tv_usec)));

    QStringList arguments = QCoreApplication::arguments();
    QString argument0 = arguments.isEmpty() ? QCoreApplication::applicationFilePath()
                                            : arguments.at(0);

    // tell the session manager about our program in best POSIX style
    sm_setProperty(QString::fromLatin1(SmProgram), argument0);
    // tell the session manager about our user as well.
    struct passwd *entryPtr = nullptr;
#if defined(_POSIX_THREAD_SAFE_FUNCTIONS) && (_POSIX_THREAD_SAFE_FUNCTIONS - 0 > 0)
    QVarLengthArray<char, 1024> buf(qMax<long>(sysconf(_SC_GETPW_R_SIZE_MAX), 1024L));
    struct passwd entry;
    while (getpwuid_r(geteuid(), &entry, buf.data(), buf.size(), &entryPtr) == ERANGE) {
        if (buf.size() >= 32768) {
            // too big already, fail
            static char badusername[] = "";
            entryPtr = &entry;
            entry.pw_name = badusername;
            break;
        }

        // retry with a bigger buffer
        buf.resize(buf.size() * 2);
    }
#else
    entryPtr = getpwuid(geteuid());
#endif
    if (entryPtr)
        sm_setProperty(QString::fromLatin1(SmUserID), QString::fromLocal8Bit(entryPtr->pw_name));

    // generate a restart and discard command that makes sense
    QStringList restart;
    restart << argument0 << "-session"_L1 << sm->sessionId() + u'_' + sm->sessionKey();

    QFileInfo fi(QCoreApplication::applicationFilePath());
    if (qAppName().compare(fi.fileName(), Qt::CaseInsensitive) != 0)
        restart << "-name"_L1 << qAppName();
    sm->setRestartCommand(restart);
    QStringList discard;
    sm->setDiscardCommand(discard);

    switch (sm_saveType) {
    case SmSaveBoth:
        sm->appCommitData();
        if (sm_isshutdown && sm_cancel)
            break; // we cancelled the shutdown, no need to save state
    Q_FALLTHROUGH();
    case SmSaveLocal:
        sm->appSaveState();
        break;
    case SmSaveGlobal:
        sm->appCommitData();
        break;
    default:
        break;
    }

    if (sm_phase2 && !sm_in_phase2) {
        SmcRequestSaveYourselfPhase2(smcConnection, sm_saveYourselfPhase2Callback, (SmPointer*) sm);
        qt_sm_blockUserInput = false;
    } else {
        // close eventual interaction monitors and cancel the
        // shutdown, if required. Note that we can only cancel when
        // performing a shutdown, it does not work for checkpoints
        if (sm_interactionActive) {
            SmcInteractDone(smcConnection, sm_isshutdown && sm_cancel);
            sm_interactionActive = false;
        } else if (sm_cancel && sm_isshutdown) {
            if (sm->allowsErrorInteraction()) {
                SmcInteractDone(smcConnection, True);
                sm_interactionActive = false;
            }
        }

        // set restart and discard command in session manager
        sm_setProperty(QString::fromLatin1(SmRestartCommand), sm->restartCommand());
        sm_setProperty(QString::fromLatin1(SmDiscardCommand), sm->discardCommand());

        // set the restart hint
        SmPropValue prop;
        prop.length = sizeof(int);
        int value = sm->restartHint();
        prop.value = (SmPointer) &value;
        sm_setProperty(SmRestartStyleHint, SmCARD8, 1, &prop);

        // we are done
        SmcSaveYourselfDone(smcConnection, !sm_cancel);
    }
}